

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_search.c
# Opt level: O3

ps_search_t *
fsg_search_init(char *name,fsg_model_t *fsg,ps_config_t *config,acmod_t *acmod,dict_t *dict,
               dict2pid_t *d2p)

{
  logmath_t *plVar1;
  dict_t *pdVar2;
  int iVar3;
  s3wid_t sVar4;
  uint uVar5;
  int iVar6;
  ps_search_t *search;
  fsg_model_t *pfVar7;
  ps_searchfuncs_t *ppVar8;
  ps_search_t *ppVar9;
  dictword_t *pdVar10;
  char *altword;
  long lVar11;
  uint uVar12;
  char *pcVar13;
  double dVar14;
  
  search = (ps_search_t *)
           __ckd_calloc__(1,0x130,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                          ,0xb6);
  ps_search_init(search,&fsg_funcs,"fsg",name,config,acmod,dict,d2p);
  pfVar7 = fsg_model_retain(fsg);
  search[1].type = (char *)pfVar7;
  ppVar8 = (ps_searchfuncs_t *)
           hmm_context_init(acmod->mdef->n_emit_state,acmod->tmat->tp,(int16 *)0x0,acmod->mdef->sseq
                           );
  search[1].vt = ppVar8;
  if (ppVar8 == (ps_searchfuncs_t *)0x0) {
    (*search->vt->free)(search);
LAB_001292a2:
    search = (ps_search_t *)0x0;
  }
  else {
    ppVar9 = (ps_search_t *)fsg_history_init((fsg_model_t *)0x0,dict);
    search[1].pls = ppVar9;
    search[1].post = -1;
    *(undefined4 *)((long)&search[1].d2p + 4) = 0x3f800000;
    plVar1 = acmod->lmath;
    dVar14 = ps_config_float(config,"beam");
    iVar3 = logmath_log(plVar1,(float64)dVar14);
    *(int *)&search[1].dict = iVar3 >> 10;
    *(int *)&search[1].hyp_str = iVar3 >> 10;
    plVar1 = acmod->lmath;
    dVar14 = ps_config_float(config,"pbeam");
    iVar3 = logmath_log(plVar1,(float64)dVar14);
    *(int *)((long)&search[1].dict + 4) = iVar3 >> 10;
    *(int *)((long)&search[1].hyp_str + 4) = iVar3 >> 10;
    plVar1 = acmod->lmath;
    dVar14 = ps_config_float(config,"wbeam");
    iVar3 = logmath_log(plVar1,(float64)dVar14);
    *(int *)&search[1].d2p = iVar3 >> 10;
    *(int *)&search[1].dag = iVar3 >> 10;
    dVar14 = ps_config_float(config,"lw");
    *(float *)((long)&search[1].dag + 4) = (float)dVar14;
    plVar1 = acmod->lmath;
    dVar14 = ps_config_float(config,"pip");
    iVar3 = logmath_log(plVar1,(float64)dVar14);
    *(int *)&search[1].last_link = (int)((float)iVar3 * *(float *)((long)&search[1].dag + 4)) >> 10;
    plVar1 = acmod->lmath;
    dVar14 = ps_config_float(config,"wip");
    iVar3 = logmath_log(plVar1,(float64)dVar14);
    *(int *)((long)&search[1].last_link + 4) =
         (int)((float)iVar3 * *(float *)((long)&search[1].dag + 4)) >> 10;
    dVar14 = ps_config_float(config,"ascale");
    search[1].start_wid = (int32)(float)(1.0 / dVar14);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
            ,0xe0,"FSG(beam: %d, pbeam: %d, wbeam: %d; wip: %d, pip: %d)\n",
            (ulong)*(uint *)&search[1].dict,(ulong)*(uint *)((long)&search[1].dict + 4),
            (ulong)*(uint *)&search[1].d2p,(ulong)*(uint *)((long)&search[1].last_link + 4),
            (ulong)*(uint *)&search[1].last_link);
    if (0 < fsg->n_word) {
      pdVar2 = search->dict;
      lVar11 = 0;
      do {
        pcVar13 = fsg->vocab[lVar11];
        sVar4 = dict_wordid(pdVar2,pcVar13);
        if (sVar4 == -1) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                  ,0x8a,"The word \'%s\' is missing in the dictionary\n",pcVar13);
          fsg_search_free(search);
          goto LAB_001292a2;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < fsg->n_word);
    }
    iVar3 = ps_config_bool(config,"fsgusefiller");
    if ((iVar3 != 0) && (fsg->silwords == (bitvec_t *)0x0)) {
      pdVar2 = search->dict;
      dVar14 = ps_config_float(search->config,"silprob");
      fsg_model_add_silence(fsg,"<sil>",-1,(float32)(float)dVar14);
      uVar12 = pdVar2->filler_start;
      iVar3 = pdVar2->filler_end;
      if ((int)uVar12 < iVar3) {
        do {
          if ((int)uVar12 < 0) {
            pcVar13 = (char *)0x0;
          }
          else {
            pcVar13 = pdVar2->word[uVar12].word;
          }
          if ((uVar12 != pdVar2->startwid) && (uVar12 != pdVar2->finishwid)) {
            dVar14 = ps_config_float(search->config,"fillprob");
            fsg_model_add_silence(fsg,pcVar13,-1,(float32)(float)dVar14);
            iVar3 = pdVar2->filler_end;
          }
          uVar12 = uVar12 + 1;
        } while ((int)uVar12 < iVar3);
      }
    }
    iVar3 = ps_config_bool(config,"fsgusealtpron");
    if ((iVar3 != 0) && (fsg->altwords == (bitvec_t *)0x0)) {
      iVar3 = fsg->n_word;
      if ((long)iVar3 < 1) {
        uVar12 = 0;
      }
      else {
        pdVar2 = search->dict;
        lVar11 = 0;
        uVar12 = 0;
        do {
          pcVar13 = fsg->vocab[lVar11];
          uVar5 = dict_wordid(pdVar2,pcVar13);
          if (uVar5 != 0xffffffff) {
            pdVar10 = pdVar2->word;
            while (uVar5 = pdVar10[(int)uVar5].alt, uVar5 != 0xffffffff) {
              if ((int)uVar5 < 0) {
                altword = (char *)0x0;
              }
              else {
                altword = pdVar10[uVar5].word;
              }
              iVar6 = fsg_model_add_alt(fsg,pcVar13,altword);
              uVar12 = uVar12 + iVar6;
              pdVar10 = pdVar2->word;
            }
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != iVar3);
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
              ,0xaa,"Added %d alternate word transitions\n",(ulong)uVar12);
    }
    iVar3 = ps_config_bool(config,"bestpath");
    if (iVar3 != 0) {
      *(undefined1 *)((long)&search[1].n_words + 1) = 1;
    }
    fsg_search_reinit(search,search->dict,search->d2p);
    ptmr_init((ptmr_t *)&search[2].name);
  }
  return search;
}

Assistant:

ps_search_t *
fsg_search_init(const char *name,
		fsg_model_t *fsg,
                ps_config_t *config,
                acmod_t *acmod,
                dict_t *dict,
                dict2pid_t *d2p)
{
    fsg_search_t *fsgs = ckd_calloc(1, sizeof(*fsgs));
    ps_search_init(ps_search_base(fsgs), &fsg_funcs, PS_SEARCH_TYPE_FSG, name, config, acmod, dict, d2p);

    fsgs->fsg = fsg_model_retain(fsg);
    /* Initialize HMM context. */
    fsgs->hmmctx = hmm_context_init(bin_mdef_n_emit_state(acmod->mdef),
                                    acmod->tmat->tp, NULL, acmod->mdef->sseq);
    if (fsgs->hmmctx == NULL) {
        ps_search_free(ps_search_base(fsgs));
        return NULL;
    }

    /* Initialize the search history object */
    fsgs->history = fsg_history_init(NULL, dict);
    fsgs->frame = -1;

    /* Get search pruning parameters */
    fsgs->beam_factor = 1.0f;
    fsgs->beam = fsgs->beam_orig
        = (int32) logmath_log(acmod->lmath, ps_config_float(config, "beam"))
        >> SENSCR_SHIFT;
    fsgs->pbeam = fsgs->pbeam_orig
        = (int32) logmath_log(acmod->lmath, ps_config_float(config, "pbeam"))
        >> SENSCR_SHIFT;
    fsgs->wbeam = fsgs->wbeam_orig
        = (int32) logmath_log(acmod->lmath, ps_config_float(config, "wbeam"))
        >> SENSCR_SHIFT;

    /* LM related weights/penalties */
    fsgs->lw = ps_config_float(config, "lw");
    fsgs->pip = (int32) (logmath_log(acmod->lmath, ps_config_float(config, "pip"))
                           * fsgs->lw)
        >> SENSCR_SHIFT;
    fsgs->wip = (int32) (logmath_log(acmod->lmath, ps_config_float(config, "wip"))
                           * fsgs->lw)
        >> SENSCR_SHIFT;

    /* Acoustic score scale for posterior probabilities. */
    fsgs->ascale = 1.0 / ps_config_float(config, "ascale");

    E_INFO("FSG(beam: %d, pbeam: %d, wbeam: %d; wip: %d, pip: %d)\n",
           fsgs->beam_orig, fsgs->pbeam_orig, fsgs->wbeam_orig,
           fsgs->wip, fsgs->pip);

    if (!fsg_search_check_dict(fsgs, fsg)) {
        fsg_search_free(ps_search_base(fsgs));
        return NULL;
    }

    if (ps_config_bool(config, "fsgusefiller") &&
        !fsg_model_has_sil(fsg))
        fsg_search_add_silences(fsgs, fsg);

    if (ps_config_bool(config, "fsgusealtpron") &&
        !fsg_model_has_alt(fsg))
        fsg_search_add_altpron(fsgs, fsg);

#if __FSG_ALLOW_BESTPATH__
    /* If bestpath is enabled, hypotheses are generated from a ps_lattice_t.
     * This is not allowed by default because it tends to be very slow. */
    if (ps_config_bool(config, "bestpath"))
        fsgs->bestpath = TRUE;
#endif

    if (fsg_search_reinit(ps_search_base(fsgs),
                          ps_search_dict(fsgs),
                          ps_search_dict2pid(fsgs)) < 0)
    {
        ps_search_free(ps_search_base(fsgs));
        return NULL;
    
    }
    ptmr_init(&fsgs->perf);
        
    return ps_search_base(fsgs);
}